

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-type.h
# Opt level: O2

void __thiscall wasm::BinaryInstWriter::emitResultType(BinaryInstWriter *this,Type type)

{
  BufferWithRandomAccess *this_00;
  undefined1 auVar1 [16];
  S32LEB x;
  
  if (type.id == 1) {
    WasmBinaryWriter::writeType(this->parent,(Type)0x0);
    return;
  }
  if ((type.id & 1) != 0 && 6 < type.id) {
    this_00 = this->o;
    auVar1._8_8_ = 0;
    auVar1._0_8_ = type.id;
    x.value = WasmBinaryWriter::getSignatureIndex(this->parent,(Signature)(auVar1 << 0x40));
    BufferWithRandomAccess::operator<<(this_00,x);
    return;
  }
  WasmBinaryWriter::writeType(this->parent,type);
  return;
}

Assistant:

bool operator==(const BasicType& other) const { return id == other; }